

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardSubsumptionAndResolution.cpp
# Opt level: O2

void __thiscall
Inferences::BackwardSubsumptionAndResolution::perform
          (BackwardSubsumptionAndResolution *this,Clause *cl,
          BwSimplificationRecordIterator *simplifications)

{
  Clause **ppCVar1;
  int *piVar2;
  DHSet<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2> *this_00;
  uint uVar3;
  Clause *pCVar4;
  LiteralIndexingStructure<Indexing::LiteralClause> *pLVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  bool bVar9;
  uint uVar10;
  int iVar11;
  Clause *pCVar12;
  List<Inferences::BwSimplificationRecord> *pLVar13;
  uint uVar14;
  Literal *pLVar15;
  long lVar16;
  bool setSR;
  BwSimplificationRecord elem;
  BwSimplificationRecord elem_00;
  BwSimplificationRecord elem_01;
  VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
  it;
  Clause *local_68;
  QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause> res;
  
  Lib::VirtualIterator<Inferences::BwSimplificationRecord>::getEmpty();
  Lib::VirtualIterator<Inferences::BwSimplificationRecord>::operator=
            (simplifications,(VirtualIterator<Inferences::BwSimplificationRecord> *)&res);
  Lib::VirtualIterator<Inferences::BwSimplificationRecord>::~VirtualIterator
            ((VirtualIterator<Inferences::BwSimplificationRecord> *)&res);
  if ((this->_subsumption == false) && (this->_subsumptionResolution != true)) {
    return;
  }
  this_00 = &this->_checked;
  Lib::DHMap<Kernel::Clause_*,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::reset
            (&this_00->_map);
  uVar10 = (uint)*(undefined8 *)&cl->field_0x38;
  if ((uVar10 & 0xfffff) == 1) {
    pLVar15 = cl->_literals[0];
    if (this->_subsumption == true) {
      local_68 = (Clause *)0x0;
      pLVar13 = (List<Inferences::BwSimplificationRecord> *)0x0;
      (*((this->_bwIndex->super_LiteralIndex<Indexing::LiteralClause>)._is._M_t.
         super___uniq_ptr_impl<Indexing::LiteralIndexingStructure<Indexing::LiteralClause>,_std::default_delete<Indexing::LiteralIndexingStructure<Indexing::LiteralClause>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_Indexing::LiteralIndexingStructure<Indexing::LiteralClause>_*,_std::default_delete<Indexing::LiteralIndexingStructure<Indexing::LiteralClause>_>_>
         .
         super__Head_base<0UL,_Indexing::LiteralIndexingStructure<Indexing::LiteralClause>_*,_false>
        ._M_head_impl)->_vptr_LiteralIndexingStructure[7])(&it);
      while (iVar11 = (*(it._core)->_vptr_IteratorCore[2])(), (char)iVar11 != '\0') {
        (*(it._core)->_vptr_IteratorCore[3])(&res);
        pCVar4 = (res.data)->clause;
        Lib::SmartPtr<Indexing::ResultSubstitution>::~SmartPtr(&res.unifier);
        bVar8 = Lib::DHMap<Kernel::Clause_*,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>
                ::insert(&this_00->_map);
        if (bVar8) {
          ppCVar1 = &DAT_00a141a0[0x12]._head.replacement;
          *(int *)ppCVar1 = *(int *)ppCVar1 + 1;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = local_68;
          local_68 = (Clause *)
                     Lib::List<Inferences::BwSimplificationRecord>::cons
                               ((List<Inferences::BwSimplificationRecord> *)pCVar4,
                                (BwSimplificationRecord)(auVar6 << 0x40),pLVar13);
        }
      }
      Lib::
      VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
      ::~VirtualIterator(&it);
    }
    else {
      local_68 = (Clause *)0x0;
    }
    if (this->_subsumptionResolution == true) {
      pLVar5 = (this->_bwIndex->super_LiteralIndex<Indexing::LiteralClause>)._is._M_t.
               super___uniq_ptr_impl<Indexing::LiteralIndexingStructure<Indexing::LiteralClause>,_std::default_delete<Indexing::LiteralIndexingStructure<Indexing::LiteralClause>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Indexing::LiteralIndexingStructure<Indexing::LiteralClause>_*,_std::default_delete<Indexing::LiteralIndexingStructure<Indexing::LiteralClause>_>_>
               .
               super__Head_base<0UL,_Indexing::LiteralIndexingStructure<Indexing::LiteralClause>_*,_false>
               ._M_head_impl;
      (*pLVar5->_vptr_LiteralIndexingStructure[7])(&it,pLVar5,pLVar15,1,0);
      while (iVar11 = (*(it._core)->_vptr_IteratorCore[2])(), (char)iVar11 != '\0') {
        (*(it._core)->_vptr_IteratorCore[3])(&res);
        pCVar4 = (res.data)->clause;
        bVar8 = Lib::DHMap<Kernel::Clause_*,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>
                ::insert(&this_00->_map,pCVar4);
        if (bVar8) {
          pCVar12 = SATSubsumption::SATSubsumptionAndResolution::getSubsumptionResolutionConclusion
                              (pCVar4,(res.data)->literal,cl);
          pLVar13 = DAT_00a141a0;
          piVar2 = (int *)((long)&DAT_00a141a0[0xd]._head.replacement + 4);
          *piVar2 = *piVar2 + 1;
          elem.replacement = local_68;
          elem.toRemove = pCVar12;
          local_68 = (Clause *)
                     Lib::List<Inferences::BwSimplificationRecord>::cons
                               ((List<Inferences::BwSimplificationRecord> *)pCVar4,elem,pLVar13);
        }
        Lib::SmartPtr<Indexing::ResultSubstitution>::~SmartPtr(&res.unifier);
      }
      Lib::
      VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
      ::~VirtualIterator(&it);
    }
    goto joined_r0x003d4c84;
  }
  if ((this->_subsumptionByUnitsOnly == true) && (this->_srByUnitsOnly != false)) {
    return;
  }
  pLVar15 = cl->_literals[0];
  uVar14 = (pLVar15->super_Term)._weight;
  for (lVar16 = 0xf; lVar16 - 0xeU < (ulong)(uVar10 & 0xfffff); lVar16 = lVar16 + 1) {
    uVar3 = (cl->_literals[lVar16 + -0xe]->super_Term)._weight;
    if (uVar14 < uVar3) {
      pLVar15 = cl->_literals[lVar16 + -0xe];
      uVar14 = uVar3;
    }
  }
  if (this->_subsumptionByUnitsOnly == false) {
    pLVar5 = (this->_bwIndex->super_LiteralIndex<Indexing::LiteralClause>)._is._M_t.
             super___uniq_ptr_impl<Indexing::LiteralIndexingStructure<Indexing::LiteralClause>,_std::default_delete<Indexing::LiteralIndexingStructure<Indexing::LiteralClause>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Indexing::LiteralIndexingStructure<Indexing::LiteralClause>_*,_std::default_delete<Indexing::LiteralIndexingStructure<Indexing::LiteralClause>_>_>
             .
             super__Head_base<0UL,_Indexing::LiteralIndexingStructure<Indexing::LiteralClause>_*,_false>
             ._M_head_impl;
    local_68 = (Clause *)0x0;
    (*pLVar5->_vptr_LiteralIndexingStructure[7])(&it,pLVar5,pLVar15,0,0);
LAB_003d4a9d:
    do {
      iVar11 = (*(it._core)->_vptr_IteratorCore[2])();
      if ((char)iVar11 == '\0') goto LAB_003d4ba1;
      (*(it._core)->_vptr_IteratorCore[3])(&res);
      pCVar4 = (res.data)->clause;
      Lib::SmartPtr<Indexing::ResultSubstitution>::~SmartPtr(&res.unifier);
      bVar8 = Lib::DHMap<Kernel::Clause_*,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::
              insert(&this_00->_map,pCVar4);
      if (bVar8) {
        bVar8 = (bool)((this->_subsumptionByUnitsOnly ^ 1U) & this->_subsumption);
        setSR = (bool)((this->_srByUnitsOnly ^ 1U) & this->_subsumptionResolution);
        if (bVar8 == true) {
          pLVar13 = (List<Inferences::BwSimplificationRecord> *)(ulong)setSR;
          bVar9 = SATSubsumption::SATSubsumptionAndResolution::checkSubsumption
                            (&this->_satSubs,cl,pCVar4,setSR);
          if (bVar9) {
            ppCVar1 = &DAT_00a141a0[0x12]._head.replacement;
            *(int *)ppCVar1 = *(int *)ppCVar1 + 1;
            auVar7._8_8_ = 0;
            auVar7._0_8_ = local_68;
            local_68 = (Clause *)
                       Lib::List<Inferences::BwSimplificationRecord>::cons
                                 ((List<Inferences::BwSimplificationRecord> *)pCVar4,
                                  (BwSimplificationRecord)(auVar7 << 0x40),pLVar13);
            goto LAB_003d4a9d;
          }
        }
        if ((setSR != false) &&
           (pCVar12 = SATSubsumption::SATSubsumptionAndResolution::checkSubsumptionResolution
                                (&this->_satSubs,cl,pCVar4,bVar8), pLVar13 = DAT_00a141a0,
           pCVar12 != (Clause *)0x0)) {
          piVar2 = (int *)((long)&DAT_00a141a0[0xd]._head.replacement + 4);
          *piVar2 = *piVar2 + 1;
          elem_00.replacement = local_68;
          elem_00.toRemove = pCVar12;
          local_68 = (Clause *)
                     Lib::List<Inferences::BwSimplificationRecord>::cons
                               ((List<Inferences::BwSimplificationRecord> *)pCVar4,elem_00,pLVar13);
        }
      }
    } while( true );
  }
  local_68 = (Clause *)0x0;
LAB_003d4bb0:
  if ((this->_subsumptionResolution == true) && (this->_srByUnitsOnly == false)) {
    pLVar5 = (this->_bwIndex->super_LiteralIndex<Indexing::LiteralClause>)._is._M_t.
             super___uniq_ptr_impl<Indexing::LiteralIndexingStructure<Indexing::LiteralClause>,_std::default_delete<Indexing::LiteralIndexingStructure<Indexing::LiteralClause>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Indexing::LiteralIndexingStructure<Indexing::LiteralClause>_*,_std::default_delete<Indexing::LiteralIndexingStructure<Indexing::LiteralClause>_>_>
             .
             super__Head_base<0UL,_Indexing::LiteralIndexingStructure<Indexing::LiteralClause>_*,_false>
             ._M_head_impl;
    (*pLVar5->_vptr_LiteralIndexingStructure[7])(&it,pLVar5,pLVar15,1,0);
    while (iVar11 = (*(it._core)->_vptr_IteratorCore[2])(), (char)iVar11 != '\0') {
      (*(it._core)->_vptr_IteratorCore[3])(&res);
      pCVar4 = (res.data)->clause;
      Lib::SmartPtr<Indexing::ResultSubstitution>::~SmartPtr(&res.unifier);
      bVar8 = Lib::DHMap<Kernel::Clause_*,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::
              insert(&this_00->_map,pCVar4);
      if ((bVar8) &&
         (pCVar12 = SATSubsumption::SATSubsumptionAndResolution::checkSubsumptionResolution
                              (&this->_satSubs,cl,pCVar4,false), pLVar13 = DAT_00a141a0,
         pCVar12 != (Clause *)0x0)) {
        piVar2 = (int *)((long)&DAT_00a141a0[0xd]._head.replacement + 4);
        *piVar2 = *piVar2 + 1;
        elem_01.replacement = local_68;
        elem_01.toRemove = pCVar12;
        local_68 = (Clause *)
                   Lib::List<Inferences::BwSimplificationRecord>::cons
                             ((List<Inferences::BwSimplificationRecord> *)pCVar4,elem_01,pLVar13);
      }
    }
    Lib::
    VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
    ::~VirtualIterator(&it);
  }
joined_r0x003d4c84:
  if (local_68 != (Clause *)0x0) {
    Lib::pvi<Lib::List<Inferences::BwSimplificationRecord>::Iterator>
              ((Lib *)&res,(Iterator)local_68);
    Lib::VirtualIterator<Inferences::BwSimplificationRecord>::operator=
              (simplifications,(VirtualIterator<Inferences::BwSimplificationRecord> *)&res);
    Lib::VirtualIterator<Inferences::BwSimplificationRecord>::~VirtualIterator
              ((VirtualIterator<Inferences::BwSimplificationRecord> *)&res);
  }
  return;
LAB_003d4ba1:
  Lib::
  VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
  ::~VirtualIterator(&it);
  goto LAB_003d4bb0;
}

Assistant:

void BackwardSubsumptionAndResolution::perform(Clause *cl,
                                               BwSimplificationRecordIterator &simplifications)
{
  ASSERT_VALID(*cl)
  ASS(_bwIndex)
  simplifications = BwSimplificationRecordIterator::getEmpty();

  if (!_subsumption && !_subsumptionResolution) {
    return;
  }

  _checked.reset();

  // contains the list of simplifications found so far
  List<BwSimplificationRecord> *simplificationBuffer = List<BwSimplificationRecord>::empty();

  /********************************************************/
  /*                      cl is UNIT                      */
  /********************************************************/
  // cl is a unit clause and will subsume all clauses that contain its literal
  // and will be resolved with all clauses that contain its negation
  if (cl->length() == 1) {
    Literal *lit = (*cl)[0];
    // Check for the subsumptions
    if (_subsumption) {
      /***************************************************/
      /*            SUBSUMPTION UNIT CLAUSE              */
      /***************************************************/
      auto it = _bwIndex->getInstances(lit, false, false);
      while (it.hasNext()) {
        Clause *icl = it.next().data->clause;
        if (!_checked.insert(icl))
          continue;
        env.statistics->backwardSubsumed++;
        List<BwSimplificationRecord>::push(BwSimplificationRecord(icl), simplificationBuffer);
      }
    }
    if (_subsumptionResolution) {
      /***************************************************/
      /*      SUBSUMPTION RESOLUTION UNIT CLAUSE         */
      /***************************************************/
      auto it = _bwIndex->getInstances(lit, true, false);
      while (it.hasNext()) {
        auto res = it.next();
        Clause *icl = res.data->clause;
        if (!_checked.insert(icl))
          continue;
        Clause *conclusion = SATSubsumption::SATSubsumptionAndResolution::getSubsumptionResolutionConclusion(icl, res.data->literal, cl);
        ASS(conclusion)
        env.statistics->backwardSubsumptionResolution++;
        List<BwSimplificationRecord>::push(BwSimplificationRecord(icl, conclusion), simplificationBuffer);
      }
    }
    if (simplificationBuffer)
      simplifications = pvi(List<BwSimplificationRecord>::Iterator(simplificationBuffer));
    return;
  }

  if (_subsumptionByUnitsOnly && _srByUnitsOnly) {
    ASS(!simplificationBuffer)
    if (simplificationBuffer)
      simplifications = pvi(List<BwSimplificationRecord>::Iterator(simplificationBuffer));
    return;
  }

  /*******************************************************/
  /*       SUBSUMPTION & RESOLUTION MULTI-LITERAL        */
  /*******************************************************/
  // We use the optimization from Krystof Hoder and only search the instances of the least matchable
  // literal. Indeed, since for subsumption and subsumption resolution, each literal in the subsuming
  // clause S must be matched at least one literal in the subsumed clause M (idem for SR).
  // Therefore checking the instances of the least matchable literal will limit the number of candidates
  // for both subsumption and subsumption resolution.
  // For now, the least matchable literal is the heaviest literal in the clause. But this heuristic
  // could probably be improved.
  Literal* lit = (*cl)[0];
  unsigned lmVal = lit->weight();
  for(unsigned i = 1; i < cl->length(); i++) {
    Literal* curr = (*cl)[i];
    unsigned currVal = curr->weight();
    if(currVal > lmVal) {
      lit = curr;
      lmVal = currVal;
    }
  }

  if (!_subsumptionByUnitsOnly) {
    // find the positively matched literals
    auto it = _bwIndex->getInstances(lit, false, false);
    while (it.hasNext()) {
      Clause *icl = it.next().data->clause;
      if (!_checked.insert(icl))
        continue;
      // check subsumption and setup subsumption resolution at the same time
      bool checkS = _subsumption && !_subsumptionByUnitsOnly;
      bool checkSR = _subsumptionResolution && !_srByUnitsOnly;
      if (checkS) {
        if (_satSubs.checkSubsumption(cl, icl, checkSR)) {
          env.statistics->backwardSubsumed++;
          List<BwSimplificationRecord>::push(BwSimplificationRecord(icl), simplificationBuffer);
          continue;
        }
      }
      if (checkSR) {
        // check subsumption resolution
        Clause *conclusion = _satSubs.checkSubsumptionResolution(cl, icl, checkS); // use the previous setup only if subsumption was checked
        if (conclusion) {
          env.statistics->backwardSubsumptionResolution++;
          List<BwSimplificationRecord>::push(BwSimplificationRecord(icl, conclusion), simplificationBuffer);
        }
      }
    }
  }

  /*******************************************************/
  /*       SUBSUMPTION RESOLUTION MULTI-LITERAL          */
  /*******************************************************/
  if (_subsumptionResolution && !_srByUnitsOnly) {
    // find the negatively matched literals
    // We can use the same least matchable literal as before since our method is agnostic to the
    // flipped literal
    auto it = _bwIndex->getInstances(lit, true, false);
    while (it.hasNext()) {
      Clause *icl = it.next().data->clause;
      if (!_checked.insert(icl))
        continue;
      // check subsumption resolution
      Clause *conclusion = _satSubs.checkSubsumptionResolution(cl, icl, false);
      if (conclusion) {
        env.statistics->backwardSubsumptionResolution++;
        List<BwSimplificationRecord>::push(BwSimplificationRecord(icl, conclusion), simplificationBuffer);
      }
    }
  }

  if (simplificationBuffer) {
    simplifications = pvi(List<BwSimplificationRecord>::Iterator(simplificationBuffer));
  }
}